

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng.c
# Opt level: O2

int light_get_block_info(light_pcapng pcapng,light_info info_flag,void *info_data,size_t *data_size)

{
  uint32_t uVar1;
  _light_option *p_Var2;
  size_t sStack_8;
  
  if (LIGHT_INFO_MAX < info_flag || pcapng == (light_pcapng)0x0) {
    return -3;
  }
  switch(info_flag) {
  case LIGHT_INFO_TYPE:
    if (info_data != (void *)0x0) {
      uVar1 = pcapng->block_type;
LAB_00102fa6:
      *(uint32_t *)info_data = uVar1;
    }
    break;
  case LIGHT_INFO_LENGTH:
    if (info_data != (void *)0x0) {
      uVar1 = pcapng->block_total_lenght;
      goto LAB_00102fa6;
    }
    break;
  case LIGHT_INFO_BODY:
    if (info_data != (void *)0x0) {
      p_Var2 = (_light_option *)pcapng->block_body;
LAB_00102f92:
      *(_light_option **)info_data = p_Var2;
    }
    goto LAB_00102f95;
  case LIGHT_INFO_OPTIONS:
    if (info_data != (void *)0x0) {
      p_Var2 = pcapng->options;
      goto LAB_00102f92;
    }
LAB_00102f95:
    if (data_size == (size_t *)0x0) {
      return 0;
    }
    sStack_8 = 8;
    goto LAB_00102faf;
  default:
    goto switchD_00102f73_default;
  }
  if (data_size != (size_t *)0x0) {
    sStack_8 = 4;
LAB_00102faf:
    *data_size = sStack_8;
  }
switchD_00102f73_default:
  return 0;
}

Assistant:

int light_get_block_info(const light_pcapng pcapng, light_info info_flag, void *info_data, size_t *data_size)
{
	if (pcapng == NULL || info_flag < 0 || info_flag > LIGHT_INFO_MAX) {
		return LIGHT_INVALID_ARGUMENT;
	}

	switch (info_flag) {
	case LIGHT_INFO_TYPE:
	{
		uint32_t *type = (uint32_t *)info_data;
		if (type)
			*type = pcapng->block_type;
		if (data_size)
			*data_size = sizeof(*type);
		break;
	}
	case LIGHT_INFO_LENGTH:
	{
		uint32_t *length = (uint32_t *)info_data;
		if (length)
			*length = pcapng->block_total_lenght;
		if (data_size)
			*data_size = sizeof(*length);
		break;
	}
	case LIGHT_INFO_BODY:
	{
		uint32_t **body = (uint32_t **)info_data;
		if (body)
			*body = pcapng->block_body;
		if (data_size)
			*data_size = sizeof(*body);
		break;
	}
	case LIGHT_INFO_OPTIONS:
	{
		light_option *body = (light_option *)info_data;
		if (body)
			*body = pcapng->options;
		if (data_size)
			*data_size = sizeof(*body);
		break;
	}
	default:
		break;
	}

	return LIGHT_SUCCESS;
}